

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_json.c
# Opt level: O3

int mixed_type_union_tests(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  
  uVar1 = test_json(&Movie,
                    "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 } }"
                    ,
                    "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19}}"
                    ,0,0,0,0x1b3);
  uVar2 = test_json(&Movie,
                    "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },  \"side_kick_type\": \"Other\", \"side_kick\": \"a donkey\"}"
                    ,
                    "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\"}"
                    ,0,0,0,0x1b8);
  uVar3 = test_json(&Movie,
                    "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },  \"side_kick_type\": \"Fantasy.Character.Other\", \"side_kick\": \"a donkey\"}}"
                    ,
                    "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\"}"
                    ,0,0,0,0x1bd);
  uVar4 = test_json(&Movie,
                    "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },  \"side_kick_type\": \"Fantasy.Character.Other\", \"side_kick\": \"a donkey\",  \"antagonist_type\": \"MuLan\", \"antagonist\": {\"sword_attack_damage\": 42}}"
                    ,
                    "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},\"antagonist_type\":\"MuLan\",\"antagonist\":{\"sword_attack_damage\":42},\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\"}"
                    ,0,0,0,0x1c4);
  uVar5 = test_json(&Movie,
                    "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },  \"side_kick_type\": \"Fantasy.Character.Other\", \"side_kick\": \"a donkey\",  \"antagonist_type\": \"MuLan\", \"antagonist\": {\"sword_attack_damage\": 42}, \"characters_type\": [], \"characters\": []}"
                    ,
                    "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},\"antagonist_type\":\"MuLan\",\"antagonist\":{\"sword_attack_damage\":42},\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\",\"characters_type\":[],\"characters\":[]}"
                    ,0,0,0,0x1cd);
  uVar6 = test_json(&Movie,
                    "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },  \"side_kick_type\": \"Fantasy.Character.Other\", \"side_kick\": \"a donkey\",  \"antagonist_type\": \"MuLan\", \"antagonist\": {\"sword_attack_damage\": 42}, \"characters_type\": [\"Fantasy.Character.Rapunzel\", \"Other\", 0, \"MuLan\"], \"characters\": [{\"hair_length\":19}, \"unattributed extras\", null, {\"sword_attack_damage\":2}]}"
                    ,
                    "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},\"antagonist_type\":\"MuLan\",\"antagonist\":{\"sword_attack_damage\":42},\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\",\"characters_type\":[\"Rapunzel\",\"Other\",\"NONE\",\"MuLan\"],\"characters\":[{\"hair_length\":19},\"unattributed extras\",null,{\"sword_attack_damage\":2}]}"
                    ,0,0,0,0x1d8);
  uVar7 = test_json(&Movie,
                    "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },  \"side_kick_type\": \"Character.Other\", \"side_kick\": \"a donkey\"}"
                    ,
                    "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\"}"
                    ,0,0,0,0x1dd);
  return uVar7 | uVar6 | uVar5 | uVar4 | uVar3 | uVar2 | uVar1;
}

Assistant:

int mixed_type_union_tests(void)
{
    BEGIN_TEST(Movie);

    /* Reference */

    TEST(   "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 } }",
            "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19}}");

    TEST(   "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },"
            "  \"side_kick_type\": \"Other\", \"side_kick\": \"a donkey\"}",
            "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},"
            "\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\"}");

    TEST(   "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },"
            "  \"side_kick_type\": \"Fantasy.Character.Other\", \"side_kick\": \"a donkey\"}}",
            "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},"
            "\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\"}");

    TEST(   "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },"
            "  \"side_kick_type\": \"Fantasy.Character.Other\", \"side_kick\": \"a donkey\","
            "  \"antagonist_type\": \"MuLan\", \"antagonist\": {\"sword_attack_damage\": 42}}",
            "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},"
            "\"antagonist_type\":\"MuLan\",\"antagonist\":{\"sword_attack_damage\":42},"
            "\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\"}");

    TEST(   "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },"
            "  \"side_kick_type\": \"Fantasy.Character.Other\", \"side_kick\": \"a donkey\","
            "  \"antagonist_type\": \"MuLan\", \"antagonist\": {\"sword_attack_damage\": 42},"
            " \"characters_type\": [], \"characters\": []}",
            "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},"
            "\"antagonist_type\":\"MuLan\",\"antagonist\":{\"sword_attack_damage\":42},"
            "\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\","
            "\"characters_type\":[],\"characters\":[]}")

    TEST(   "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },"
            "  \"side_kick_type\": \"Fantasy.Character.Other\", \"side_kick\": \"a donkey\","
            "  \"antagonist_type\": \"MuLan\", \"antagonist\": {\"sword_attack_damage\": 42},"
            " \"characters_type\": [\"Fantasy.Character.Rapunzel\", \"Other\", 0, \"MuLan\"],"
            " \"characters\": [{\"hair_length\":19}, \"unattributed extras\", null, {\"sword_attack_damage\":2}]}",
            "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},"
            "\"antagonist_type\":\"MuLan\",\"antagonist\":{\"sword_attack_damage\":42},"
            "\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\","
            "\"characters_type\":[\"Rapunzel\",\"Other\",\"NONE\",\"MuLan\"],"
            "\"characters\":[{\"hair_length\":19},\"unattributed extras\",null,{\"sword_attack_damage\":2}]}")

    TEST(   "{ \"main_character_type\": \"Rapunzel\", \"main_character\": { \"hair_length\": 19 },"
            "  \"side_kick_type\": \"Character.Other\", \"side_kick\": \"a donkey\"}",
            "{\"main_character_type\":\"Rapunzel\",\"main_character\":{\"hair_length\":19},"
            "\"side_kick_type\":\"Other\",\"side_kick\":\"a donkey\"}");

    END_TEST();
}